

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_returns_an_uncompressed_message_that_we_can_compress_later_Test
::TestBody(SubjectSetRegisterTest_next_subscription_sync_returns_an_uncompressed_message_that_we_can_compress_later_Test
           *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message_00;
  char *in_R9;
  AssertHelper local_168;
  AssertHelper local_160;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> message;
  SubjectSetRegister subject_register;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(&subject_register);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_128,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_128,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  this_00 = &gtest_ar_.message_;
  gtest_ar_.success_ =
       message.super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
       _M_payload.
       super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
       .super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>._M_engaged;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (message.super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
      _M_payload.
      super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>.
      super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>._M_engaged ==
      false) {
    testing::Message::Message((Message *)&local_168);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x1f6f66,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0xa6,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_168);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(this_00);
    gtest_ar_.success_ = false;
    local_168.data_._0_1_ = bidfx_public_api::price::pixie::SubscriptionSync::IsCompressed();
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&gtest_ar,"false","message->IsCompressed()",&gtest_ar_.success_,
               (bool *)&local_168);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message_00 = "";
      }
      else {
        message_00 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
                 ,0xa7,message_00);
      testing::internal::AssertHelper::operator=(&local_168,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    this_00 = &gtest_ar.message_;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this_00);
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)&message);
  SubjectSetRegister::~SubjectSetRegister(&subject_register);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_returns_an_uncompressed_message_that_we_can_compress_later)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT0, false);
    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();
    ASSERT_TRUE(message);
    EXPECT_EQ(false, message->IsCompressed());
}